

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O3

void __thiscall
SoundConfigTab::SoundConfigTab
          (SoundConfigTab *this,MidiConfig *midiConfig,SoundConfig *soundConfig,
          AudioEnumerator *audio,MidiEnumerator *midi,QWidget *parent)

{
  AudioEnumerator *enumerator;
  MidiEnumerator *enumerator_00;
  QPushButton *pQVar1;
  SoundConfigTab *pSVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  DeviceGroup *pDVar6;
  QGroupBox *this_00;
  QGridLayout *this_01;
  QLabel *pQVar7;
  QSpinBox *pQVar8;
  QComboBox *pQVar9;
  QVBoxLayout *this_02;
  undefined4 *puVar10;
  size_t index;
  anon_union_24_3_e3d07ef4_for_data local_f8;
  undefined8 local_e0;
  SoundConfigTab *local_d0;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  SoundConfig *local_b0;
  MidiConfig *local_a8;
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QIcon local_50 [8];
  QArrayData *local_48 [3];
  
  local_b0 = soundConfig;
  local_a8 = midiConfig;
  ConfigTab::ConfigTab(&this->super_ConfigTab,parent);
  *(undefined ***)&this->super_ConfigTab = &PTR_metaObject_001fac50;
  *(undefined ***)&(this->super_ConfigTab).field_0x10 = &PTR__SoundConfigTab_001fae00;
  this->mAudioEnumerator = audio;
  this->mMidiEnumerator = midi;
  pDVar6 = (DeviceGroup *)operator_new(0x48);
  local_d0 = this;
  QMetaObject::tr((char *)local_f8.data,(char *)&staticMetaObject,0x1b3fe4);
  DeviceGroup::DeviceGroup(pDVar6,(QString *)&local_f8);
  this->mAudioGroup = pDVar6;
  if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
    UNLOCK();
    if (*(int *)local_f8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
    }
  }
  this_00 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)local_f8.data,(char *)&staticMetaObject,0x1b3ff2);
  QGroupBox::QGroupBox(this_00,(QString *)&local_f8,(QWidget *)0x0);
  if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
    UNLOCK();
    if (*(int *)local_f8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
    }
  }
  this_01 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_01,(QWidget *)0x0);
  pQVar7 = (QLabel *)operator_new(0x28);
  QMetaObject::tr((char *)local_f8.data,(char *)&staticMetaObject,0x1b4002);
  QLabel::QLabel(pQVar7,&local_f8,0,0);
  QGridLayout::addWidget(this_01,pQVar7,0,0,0);
  if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
    UNLOCK();
    if (*(int *)local_f8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
    }
  }
  pQVar8 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar8,(QWidget *)0x0);
  this->mLatencySpin = pQVar8;
  QGridLayout::addWidget(this_01,pQVar8,0,1,0);
  pQVar7 = (QLabel *)operator_new(0x28);
  QMetaObject::tr((char *)local_f8.data,(char *)&staticMetaObject,0x1b400e);
  QLabel::QLabel(pQVar7,&local_f8,0,0);
  QGridLayout::addWidget(this_01,pQVar7,1,0,0);
  if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
    UNLOCK();
    if (*(int *)local_f8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
    }
  }
  pQVar8 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar8,(QWidget *)0x0);
  this->mPeriodSpin = pQVar8;
  QGridLayout::addWidget(this_01,pQVar8,1,1,0);
  pQVar7 = (QLabel *)operator_new(0x28);
  QMetaObject::tr((char *)local_f8.data,(char *)&staticMetaObject,0x1b4015);
  QLabel::QLabel(pQVar7,&local_f8,0,0);
  QGridLayout::addWidget(this_01,pQVar7,2,0,0);
  if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
    UNLOCK();
    if (*(int *)local_f8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
    }
  }
  pQVar9 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar9,(QWidget *)0x0);
  this->mSamplerateCombo = pQVar9;
  QGridLayout::addWidget(this_01,pQVar9,2,1,0);
  QWidget::setLayout((QLayout *)this_00);
  pDVar6 = (DeviceGroup *)operator_new(0x48);
  QMetaObject::tr((char *)local_f8.data,(char *)&staticMetaObject,0x1b4021);
  DeviceGroup::DeviceGroup(pDVar6,(QString *)&local_f8);
  this->mMidiGroup = pDVar6;
  if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
    UNLOCK();
    if (*(int *)local_f8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
    }
  }
  QGroupBox::setCheckable(SUB81(this->mMidiGroup,0));
  pDVar6 = this->mMidiGroup;
  MidiConfig::isEnabled(local_a8);
  QGroupBox::setChecked(SUB81(pDVar6,0));
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02);
  QBoxLayout::addWidget(this_02,this->mAudioGroup,0,0);
  QBoxLayout::addWidget(this_02,this_00,0,0);
  QBoxLayout::addWidget(this_02,this->mMidiGroup,0,0);
  QBoxLayout::addStretch((int)this_02);
  QWidget::setLayout((QLayout *)this);
  enumerator = this->mAudioEnumerator;
  pDVar6 = this->mAudioGroup;
  iVar3 = SoundConfig::backendIndex(local_b0);
  iVar4 = SoundConfig::deviceIndex(local_b0);
  DeviceGroup::init<AudioEnumerator>(pDVar6,enumerator,iVar3,iVar4);
  index = 0;
  do {
    pQVar9 = local_d0->mSamplerateCombo;
    QMetaObject::tr((char *)local_48,(char *)&staticMetaObject,0x1b402c);
    iVar3 = StandardRates::get(index);
    QString::arg((longlong)&local_c8,(int)local_48,iVar3,(QChar)0x0);
    local_f8.shared = (PrivateShared *)0x0;
    local_f8._8_8_ = 0;
    local_f8._16_8_ = 0;
    local_e0 = 2;
    uVar5 = QComboBox::count();
    QIcon::QIcon(local_50);
    QComboBox::insertItem
              ((int)pQVar9,(QIcon *)(ulong)uVar5,(QString *)local_50,(QVariant *)&local_c8);
    QIcon::~QIcon(local_50);
    QVariant::~QVariant((QVariant *)&local_f8);
    if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
      UNLOCK();
      if (*(int *)local_c8.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
      }
    }
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,8);
      }
    }
    pSVar2 = local_d0;
    index = index + 1;
  } while (index != 7);
  pQVar9 = local_d0->mSamplerateCombo;
  SoundConfig::samplerateIndex(local_b0);
  QComboBox::setCurrentIndex((int)pQVar9);
  pQVar8 = pSVar2->mLatencySpin;
  SoundConfig::latency(local_b0);
  QSpinBox::setValue((int)pQVar8);
  pQVar8 = pSVar2->mPeriodSpin;
  SoundConfig::period(local_b0);
  QSpinBox::setValue((int)pQVar8);
  pQVar8 = pSVar2->mLatencySpin;
  QMetaObject::tr((char *)local_f8.data,(char *)&staticMetaObject,0x1b5164);
  QSpinBox::setSuffix((QString *)pQVar8);
  if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
    UNLOCK();
    if (*(int *)local_f8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
    }
  }
  pSVar2 = local_d0;
  iVar3 = (int)pQVar8;
  QSpinBox::setMinimum(iVar3);
  QSpinBox::setMaximum(iVar3);
  pQVar8 = pSVar2->mPeriodSpin;
  QMetaObject::tr((char *)local_f8.data,(char *)&staticMetaObject,0x1b5164);
  QSpinBox::setSuffix((QString *)pQVar8);
  if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
    UNLOCK();
    if (*(int *)local_f8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
    }
  }
  pSVar2 = local_d0;
  iVar3 = (int)pQVar8;
  QSpinBox::setMinimum(iVar3);
  QSpinBox::setMaximum(iVar3);
  enumerator_00 = pSVar2->mMidiEnumerator;
  pDVar6 = pSVar2->mMidiGroup;
  iVar3 = MidiConfig::backendIndex(local_a8);
  iVar4 = MidiConfig::portIndex(local_a8);
  DeviceGroup::init<MidiEnumerator>(pDVar6,enumerator_00,iVar3,iVar4);
  pQVar9 = pSVar2->mSamplerateCombo;
  local_f8.shared = (PrivateShared *)QComboBox::currentIndexChanged;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)1>;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(ConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = ConfigTab::setDirty<(Config::Category)1>;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pQVar9,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pQVar8 = pSVar2->mLatencySpin;
  local_f8.shared = (PrivateShared *)QSpinBox::valueChanged;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)1>;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(ConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = ConfigTab::setDirty<(Config::Category)1>;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar8,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pQVar8 = pSVar2->mPeriodSpin;
  local_f8.shared = (PrivateShared *)QSpinBox::valueChanged;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)1>;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(ConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = ConfigTab::setDirty<(Config::Category)1>;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar8,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pQVar9 = pSVar2->mAudioGroup->mApiCombo;
  local_f8.shared = (PrivateShared *)QComboBox::currentIndexChanged;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)audioApiChanged;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(SoundConfigTab::*)(int),_QtPrivate::List<int>,_void>::impl;
  *(code **)(puVar10 + 4) = audioApiChanged;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)pQVar9,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  pQVar9 = pSVar2->mAudioGroup->mDeviceCombo;
  local_f8.shared = (PrivateShared *)QComboBox::currentIndexChanged;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)1>;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(ConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = ConfigTab::setDirty<(Config::Category)1>;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_78,(void **)pQVar9,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  pQVar1 = pSVar2->mAudioGroup->mRescanButton;
  local_f8.shared = (PrivateShared *)QAbstractButton::clicked;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)audioRescan;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(SoundConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = audioRescan;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_80,(void **)pQVar1,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  pDVar6 = pSVar2->mMidiGroup;
  local_f8.shared = (PrivateShared *)QGroupBox::toggled;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)8>;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(ConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = ConfigTab::setDirty<(Config::Category)8>;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_88,(void **)pDVar6,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  pQVar9 = pSVar2->mMidiGroup->mApiCombo;
  local_f8.shared = (PrivateShared *)QComboBox::currentIndexChanged;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)midiApiChanged;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(SoundConfigTab::*)(int),_QtPrivate::List<int>,_void>::impl;
  *(code **)(puVar10 + 4) = midiApiChanged;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_90,(void **)pQVar9,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  pQVar9 = pSVar2->mMidiGroup->mDeviceCombo;
  local_f8.shared = (PrivateShared *)QComboBox::currentIndexChanged;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)8>;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(ConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = ConfigTab::setDirty<(Config::Category)8>;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_98,(void **)pQVar9,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  pQVar1 = pSVar2->mMidiGroup->mRescanButton;
  local_f8.shared = (PrivateShared *)QAbstractButton::clicked;
  local_f8._8_8_ = 0;
  local_c8.shared = (PrivateShared *)midiRescan;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(SoundConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = midiRescan;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_a0,(void **)pQVar1,(QObject *)local_f8.data,(void **)pSVar2,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  return;
}

Assistant:

SoundConfigTab::SoundConfigTab(
    MidiConfig const& midiConfig,
    SoundConfig const& soundConfig,
    AudioEnumerator &audio,
    MidiEnumerator &midi,
    QWidget *parent
) :
    ConfigTab(parent),
    mAudioEnumerator(audio),
    mMidiEnumerator(midi)
{

    mAudioGroup = new DeviceGroup(tr("Output device"));

    auto audioGroup = new QGroupBox(tr("Output settings"));
    auto audioLayout = new QGridLayout;

    // row 0, buffer size (latency)
    audioLayout->addWidget(new QLabel(tr("Buffer size")), 0, 0);
    mLatencySpin = new QSpinBox;
    audioLayout->addWidget(mLatencySpin, 0, 1);

    // row 1, period
    audioLayout->addWidget(new QLabel(tr("Period")), 1, 0);
    mPeriodSpin = new QSpinBox;
    audioLayout->addWidget(mPeriodSpin, 1, 1);

    // row 2, samplerate
    audioLayout->addWidget(new QLabel(tr("Sample rate")), 2, 0);
    mSamplerateCombo = new QComboBox;
    audioLayout->addWidget(mSamplerateCombo, 2, 1);

    audioGroup->setLayout(audioLayout);

    mMidiGroup = new DeviceGroup(tr("MIDI Input"));
    mMidiGroup->setCheckable(true);
    mMidiGroup->setChecked(midiConfig.isEnabled());

    auto layout = new QVBoxLayout;
    layout->addWidget(mAudioGroup);
    layout->addWidget(audioGroup);
    layout->addWidget(mMidiGroup);
    layout->addStretch();
    setLayout(layout);


    // settings
    mAudioGroup->init(mAudioEnumerator, soundConfig.backendIndex(), soundConfig.deviceIndex());

    // populate samplerate combo
    for (int i = 0; i != StandardRates::COUNT; ++i) {
        mSamplerateCombo->addItem(tr("%1 Hz").arg(StandardRates::get(i)));
    }

    mSamplerateCombo->setCurrentIndex(soundConfig.samplerateIndex());
    mLatencySpin->setValue(soundConfig.latency());
    mPeriodSpin->setValue(soundConfig.period());

    auto setupTimeSpinbox = [](QSpinBox &spin, int min, int max) {
        spin.setSuffix(tr(" ms"));
        spin.setMinimum(min);
        spin.setMaximum(max);
    };
    setupTimeSpinbox(*mLatencySpin, SoundConfig::MIN_LATENCY, SoundConfig::MAX_LATENCY);
    setupTimeSpinbox(*mPeriodSpin, SoundConfig::MIN_PERIOD, SoundConfig::MAX_PERIOD);

    mMidiGroup->init(mMidiEnumerator, midiConfig.backendIndex(), midiConfig.portIndex());

    // any changes made by the user will mark this tab as "dirty"
    connect(mSamplerateCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);
    connect(mLatencySpin, qOverload<int>(&QSpinBox::valueChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);
    connect(mPeriodSpin, qOverload<int>(&QSpinBox::valueChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);

    connect(mAudioGroup->mApiCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::audioApiChanged);
    connect(mAudioGroup->mDeviceCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);
    lazyconnect(mAudioGroup->mRescanButton, clicked, this, audioRescan);

    lazyconnect(mMidiGroup, toggled, this, setDirty<Config::CategoryMidi>);
    connect(mMidiGroup->mApiCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::midiApiChanged);
    connect(mMidiGroup->mDeviceCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::setDirty<Config::CategoryMidi>);
    lazyconnect(mMidiGroup->mRescanButton, clicked, this, midiRescan);
}